

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O0

void gutil::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *list,string *s,char delim,bool skip_empty)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  long lVar4;
  byte in_CL;
  char in_DL;
  string *in_RSI;
  string elem;
  stringstream in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe30;
  string local_1c0 [32];
  stringstream local_1a0 [398];
  byte local_12;
  char local_11;
  
  local_12 = in_CL & 1;
  local_11 = in_DL;
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,in_RSI,_Var2);
  std::__cxx11::string::string(local_1c0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,local_1c0,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    if (((local_12 & 1) == 0) || (lVar4 = std::__cxx11::string::size(), lVar4 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffe30,(value_type *)in_RSI);
    }
  }
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void gutil::split(std::vector<std::string> &list, const std::string &s, char delim, bool skip_empty)
{
  std::stringstream in(s);
  std::string elem;

  while (getline(in, elem, delim))
  {
    if (!skip_empty || elem.size() > 0)
    {
      list.push_back(elem);
    }
  }
}